

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory_test.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_12835::DerivedSum::clone
          (DerivedSum *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00124fc0;
  puVar1[2] = &PTR_clone_00125010;
  *(int *)(puVar1 + 3) = (int)__child_stack;
  (this->super_BaseMultiParms)._vptr_BaseMultiParms = (_func_int **)(puVar1 + 2);
  *(undefined8 **)&this->m_a = puVar1;
  return (int)this;
}

Assistant:

BaseMultiParms::clone_type clone(int a) override { return make_shared<DerivedSum>(a); }